

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

cmpResult __thiscall
llvm::detail::DoubleAPFloat::compareAbsoluteValue(DoubleAPFloat *this,DoubleAPFloat *RHS)

{
  APFloat *pAVar1;
  APFloat *pAVar2;
  cmpResult cVar3;
  cmpResult cVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  Storage *pSVar8;
  
  cVar3 = APFloat::compareAbsoluteValue
                    ((this->Floats)._M_t.
                     super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                     super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl,
                     (RHS->Floats)._M_t.
                     super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                     super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl);
  if ((cVar3 == cmpEqual) &&
     (cVar4 = APFloat::compareAbsoluteValue
                        ((this->Floats)._M_t.
                         super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                         .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,
                         (RHS->Floats)._M_t.
                         super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                         .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1),
     cVar3 = cVar4, (cVar4 & ~cmpGreaterThan) == cmpLessThan)) {
    pAVar1 = (this->Floats)._M_t.
             super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
             super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
             super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
    pAVar2 = (APFloat *)(pAVar1->U).IEEE.significand.part;
    if ((pAVar1->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
      pAVar2 = pAVar1;
    }
    pSVar8 = (Storage *)(pAVar1[1].U.IEEE.significand.part + 8);
    if (pAVar1[1].U.semantics != (fltSemantics *)semPPCDoubleDouble) {
      pSVar8 = &pAVar1[1].U;
    }
    bVar5 = (*(undefined1 *)((long)&pAVar2->U + 0x12) ^ *(byte *)((long)pSVar8 + 0x12)) & 8;
    pAVar1 = (RHS->Floats)._M_t.
             super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
             super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
             super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
    pAVar2 = (APFloat *)(pAVar1->U).IEEE.significand.part;
    if ((pAVar1->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
      pAVar2 = pAVar1;
    }
    pSVar8 = (Storage *)(pAVar1[1].U.IEEE.significand.part + 8);
    if (pAVar1[1].U.semantics != (fltSemantics *)semPPCDoubleDouble) {
      pSVar8 = &pAVar1[1].U;
    }
    bVar6 = (*(undefined1 *)((long)&pAVar2->U + 0x12) ^ *(byte *)((long)pSVar8 + 0x12)) & 8;
    bVar7 = bVar5 >> 3 ^ 1;
    if ((bVar6 != 0) || (cVar3 = cmpLessThan, bVar7 != 0)) {
      if ((bVar6 >> 3 & bVar7) == 0) {
        cVar3 = cVar4;
        if (((bVar5 | bVar6) == 8) && ((bVar5 & bVar6) != 0)) {
          cVar3 = cmpGreaterThan - cVar4;
        }
      }
      else {
        cVar3 = cmpGreaterThan;
      }
    }
  }
  return cVar3;
}

Assistant:

APFloat::cmpResult
DoubleAPFloat::compareAbsoluteValue(const DoubleAPFloat &RHS) const {
  auto Result = Floats[0].compareAbsoluteValue(RHS.Floats[0]);
  if (Result != cmpEqual)
    return Result;
  Result = Floats[1].compareAbsoluteValue(RHS.Floats[1]);
  if (Result == cmpLessThan || Result == cmpGreaterThan) {
    auto Against = Floats[0].isNegative() ^ Floats[1].isNegative();
    auto RHSAgainst = RHS.Floats[0].isNegative() ^ RHS.Floats[1].isNegative();
    if (Against && !RHSAgainst)
      return cmpLessThan;
    if (!Against && RHSAgainst)
      return cmpGreaterThan;
    if (!Against && !RHSAgainst)
      return Result;
    if (Against && RHSAgainst)
      return (cmpResult)(cmpLessThan + cmpGreaterThan - Result);
  }
  return Result;
}